

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O0

Token * __thiscall llbuild::ninja::Lexer::lexVariableString(Lexer *this,Token *result)

{
  int iVar1;
  Token *pTVar2;
  int c;
  Token *result_local;
  Lexer *this_local;
  
  while( true ) {
    while( true ) {
      iVar1 = peekNextChar(this);
      if (iVar1 != 0x24) break;
      getNextChar(this);
      getNextChar(this);
    }
    if (((iVar1 == 10) || (iVar1 == -1)) || (iVar1 == 0xd)) break;
    getNextChar(this);
  }
  pTVar2 = setTokenKind(this,result,String);
  return pTVar2;
}

Assistant:

Token& Lexer::lexVariableString(Token& result) {
  // String tokens in variable assignments consume until the end of the line.
  while (true) {
    int c = peekNextChar();

    // If this is an escape character, skip the next character.
    if (c == '$') {
      getNextChar(); // Consume the actual '$'.
      getNextChar(); // Consume the next character.
      continue;
    }

    // Otherwise, continue only if this is not the EOL or EOF.
    if (c == '\n' || c == -1 || c == '\r')
      break;

    getNextChar();
  }

  return setTokenKind(result, Token::Kind::String);
}